

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_type_info.hpp
# Opt level: O2

shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true> __thiscall
duckdb::EnumTypeInfoTemplated<unsigned_int>::Deserialize
          (EnumTypeInfoTemplated<unsigned_int> *this,Deserializer *deserializer,uint32_t size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true> sVar1;
  anon_class_16_2_81344e6c func;
  uint32_t size_local;
  string_t *strings;
  LogicalType local_a0;
  Vector values_insert_order;
  
  LogicalType::LogicalType(&local_a0,VARCHAR);
  Vector::Vector(&values_insert_order,&local_a0,(ulong)size);
  LogicalType::~LogicalType(&local_a0);
  strings = (string_t *)values_insert_order.data;
  func.values_insert_order = &values_insert_order;
  func.strings = &strings;
  Deserializer::
  ReadList<duckdb::EnumTypeInfoTemplated<unsigned_int>::Deserialize(duckdb::Deserializer&,unsigned_int)::_lambda(duckdb::Deserializer::List&,unsigned_long)_1_>
            (deserializer,0xc9,"values",func);
  make_shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,duckdb::Vector&,unsigned_int&>
            ((Vector *)this,(uint *)&values_insert_order);
  Vector::~Vector(&values_insert_order);
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_true>)
         sVar1.internal.
         super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static shared_ptr<EnumTypeInfoTemplated> Deserialize(Deserializer &deserializer, uint32_t size) {
		Vector values_insert_order(LogicalType::VARCHAR, size);
		auto strings = FlatVector::GetData<string_t>(values_insert_order);

		deserializer.ReadList(201, "values", [&](Deserializer::List &list, idx_t i) {
			strings[i] = StringVector::AddStringOrBlob(values_insert_order, list.ReadElement<string>());
		});
		return make_shared_ptr<EnumTypeInfoTemplated>(values_insert_order, size);
	}